

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayReverseMethod::~ArrayReverseMethod(ArrayReverseMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~ArrayReverseMethod((ArrayReverseMethod *)0x91d978);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ArrayReverseMethod() : SystemSubroutine(KnownSystemName::Reverse, SubroutineKind::Function) {}